

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O2

int joust(monst *mon,obj *obj)

{
  skills sVar1;
  char cVar2;
  boolean bVar3;
  int iVar4;
  uint uVar5;
  xchar xVar6;
  int iVar7;
  
  iVar7 = 0;
  iVar4 = 0;
  if ((((u.uprops[0x25].intrinsic == 0) && (u.uprops[0x25].extrinsic == 0)) &&
      (iVar4 = iVar7, u.uprops[0x1b].intrinsic == 0)) &&
     (((u.umonnum != 0x9e && ((youmonst.data)->mlet != '\x1c')) &&
      ((uwep == obj || ((uswapwep == obj && (u.twoweap != '\0')))))))) {
    iVar4 = weapon_type(obj);
    cVar2 = u.weapon_skills[iVar4].skill;
    sVar1 = u.weapon_skills[0x26];
    if (cVar2 <= u.weapon_skills[0x26].skill) {
      sVar1 = u.weapon_skills[iVar4];
    }
    xVar6 = sVar1.skill;
    if (u.twoweap == '\0') {
      xVar6 = cVar2;
    }
    uVar5 = mt_random();
    iVar4 = 0;
    if ((int)(uVar5 % 5) < (int)(char)(xVar6 + (xVar6 == '\0'))) {
      if ((((uVar5 % 5 == 0) && (iVar4 = rnl(0x32), iVar4 == 0x31)) &&
          ((mon->data->mflags1 & 0x100000) == 0)) && (bVar3 = obj_resists(obj,0,100), bVar3 == '\0')
         ) {
        iVar4 = -1;
      }
      else {
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

static int joust(struct monst *mon,	/* target */
		 struct obj *obj)	/* weapon */
{
    int skill_rating, joust_dieroll;

    if (Fumbling || Stunned) return 0;
    /* sanity check; lance must be wielded in order to joust */
    if (obj != uwep && (obj != uswapwep || !u.twoweap)) return 0;

    /* if using two weapons, use worse of lance and two-weapon skills */
    skill_rating = P_SKILL(weapon_type(obj));	/* lance skill */
    if (u.twoweap && P_SKILL(P_TWO_WEAPON_COMBAT) < skill_rating)
	skill_rating = P_SKILL(P_TWO_WEAPON_COMBAT);
    if (skill_rating == P_ISRESTRICTED) skill_rating = P_UNSKILLED; /* 0=>1 */

    /* odds to joust are expert:80%, skilled:60%, basic:40%, unskilled:20% */
    if ((joust_dieroll = rn2(5)) < skill_rating) {
	if (joust_dieroll == 0 && rnl(50) == (50-1) &&
		!unsolid(mon->data) && !obj_resists(obj, 0, 100))
	    return -1;	/* hit that breaks lance */
	return 1;	/* successful joust */
    }
    return 0;	/* no joust bonus; revert to ordinary attack */
}